

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::anon_unknown_6::FindRedundantNodes::~FindRedundantNodes(FindRedundantNodes *this)

{
  FindRedundantNodes *this_local;
  
  (this->super_ConstVisitor).super_VisitorBase<true,_true>._vptr_VisitorBase =
       (_func_int **)&PTR_operator___0039cdf8;
  std::__cxx11::string::~string((string *)&this->identifier);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&this->unusedVars);
  return;
}

Assistant:

FindRedundantNodes(
      std::unordered_set<ast::NodeID> &res,
      const std::unordered_map<ast::NodeID, std::shared_ptr<ast::Type>>
          &exprType,
      const std::unordered_set<std::string> &pureFunc)
      : res(res), exprType(exprType), pureFunc(pureFunc) {}